

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O1

void __thiscall
RenX::ExemptionDatabase::process_data
          (ExemptionDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  long lVar4;
  rep rVar5;
  uint64_t uVar6;
  pointer *__ptr;
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  entry;
  _Head_base<0UL,_RenX::ExemptionDatabase::Entry_*,_false> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48._M_head_impl = (Entry *)operator_new(0x58);
  (local_48._M_head_impl)->ip = 0;
  (local_48._M_head_impl)->prefix_length = '\0';
  *(undefined3 *)&(local_48._M_head_impl)->field_0x35 = 0;
  ((local_48._M_head_impl)->setter)._M_dataplus._M_p = (pointer)0x0;
  ((local_48._M_head_impl)->setter)._M_string_length = 0;
  ((local_48._M_head_impl)->setter).field_2._M_allocated_capacity = 0;
  ((local_48._M_head_impl)->pos).__pos = 0;
  ((local_48._M_head_impl)->pos).__state.__count = 0;
  ((local_48._M_head_impl)->pos).__state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  *(undefined8 *)&(local_48._M_head_impl)->flags = 0;
  ((local_48._M_head_impl)->timestamp).__d.__r = 0;
  ((local_48._M_head_impl)->length).__r = 0;
  (local_48._M_head_impl)->steamid = 0;
  *(undefined8 *)((long)&((local_48._M_head_impl)->setter).field_2 + 8) = 0;
  ((local_48._M_head_impl)->setter)._M_dataplus._M_p =
       (pointer)&((local_48._M_head_impl)->setter).field_2;
  ((local_48._M_head_impl)->setter)._M_string_length = 0;
  ((local_48._M_head_impl)->setter).field_2._M_local_buf[0] = '\0';
  ((local_48._M_head_impl)->pos).__pos = pos.__pos;
  ((local_48._M_head_impl)->pos).__state = pos.__state;
  puVar3 = *(uint8_t **)(buffer + 8);
  uVar1 = *puVar3;
  *(uint8_t **)(buffer + 8) = puVar3 + 1;
  (local_48._M_head_impl)->flags = uVar1;
  lVar4 = *(long *)(puVar3 + 1);
  *(uint8_t **)(buffer + 8) = puVar3 + 9;
  ((local_48._M_head_impl)->timestamp).__d.__r = lVar4 * 1000000000;
  rVar5 = *(rep *)(puVar3 + 9);
  *(uint8_t **)(buffer + 8) = puVar3 + 0x11;
  ((local_48._M_head_impl)->length).__r = rVar5;
  uVar6 = *(uint64_t *)(puVar3 + 0x11);
  *(uint8_t **)(buffer + 8) = puVar3 + 0x19;
  (local_48._M_head_impl)->steamid = uVar6;
  uVar2 = *(uint32_t *)(puVar3 + 0x19);
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1d;
  (local_48._M_head_impl)->ip = uVar2;
  uVar1 = puVar3[0x1d];
  *(uint8_t **)(buffer + 8) = puVar3 + 0x1e;
  (local_48._M_head_impl)->prefix_length = uVar1;
  _Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>::
  interpret<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,
             (_Jupiter_DataBuffer_partial_specialization_impl_std_string<std::__cxx11::basic_string>
              *)(buffer + 8),(uint8_t **)(ulong)CONCAT31((int3)(uVar2 >> 8),uVar1));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_48._M_head_impl)->setter,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
  ::
  emplace_back<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>
            ((vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>,std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,std::default_delete<RenX::ExemptionDatabase::Entry>>>>
              *)&this->m_entries,
             (unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
              *)&local_48);
  if (local_48._M_head_impl != (Entry *)0x0) {
    std::default_delete<RenX::ExemptionDatabase::Entry>::operator()
              ((default_delete<RenX::ExemptionDatabase::Entry> *)&local_48,local_48._M_head_impl);
  }
  return;
}

Assistant:

void RenX::ExemptionDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint8_t>();
	entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
	entry->length = std::chrono::seconds(buffer.pop<int64_t>());
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	entry->setter = buffer.pop<std::string>();

	m_entries.push_back(std::move(entry));
}